

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O3

bool ImPlot::DragPoint(char *id,double *x,double *y,bool show_label,ImVec4 *col,float radius)

{
  double dVar1;
  double dVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  ImPlotPlot *pIVar5;
  ImPlotContext *pIVar6;
  bool bVar7;
  ImU32 col_00;
  ImDrawList *this;
  bool bVar8;
  ulong uVar9;
  ImVec2 IVar10;
  ImVec2 IVar11;
  float fVar12;
  double dVar13;
  ImPlotPoint IVar14;
  ImVec2 pos;
  ImVec4 color;
  ImVec2 label_pos;
  char buff1 [32];
  float local_88;
  float fStack_84;
  ImVec2 local_60;
  char buff2 [32];
  
  pIVar6 = GImPlot;
  if (GImPlot->CurrentPlot == (ImPlotPlot *)0x0) {
    __assert_fail("(gp.CurrentPlot != __null) && \"DragPoint() needs to be called between BeginPlot() and EndPlot()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xb71,
                  "bool ImPlot::DragPoint(const char *, double *, double *, bool, const ImVec4 &, float)"
                 );
  }
  GetPlotLimits((ImPlotLimits *)buff1,-1);
  if ((*x < (double)CONCAT44(buff1._4_4_,buff1._0_4_)) || ((double)buff1._8_8_ < *x)) {
    return false;
  }
  if (*y < (double)buff1._16_8_) {
    return false;
  }
  if (*y <= (double)buff1._24_8_) {
    fVar12 = 5.0;
    if (5.0 <= radius + radius) {
      fVar12 = radius + radius;
    }
    if ((col->w == -1.0) && (!NAN(col->w))) {
      col = ImGui::GetStyleColorVec4(0);
    }
    color.x = col->x;
    color.y = col->y;
    color.z = col->z;
    color.w = col->w;
    col_00 = ImGui::ColorConvertFloat4ToU32(&color);
    this = ImGui::GetWindowDrawList();
    IVar10 = PlotToPixels(*x,*y,-1);
    iVar3 = GImPlot->CurrentPlot->CurrentYAxis;
    pos = IVar10;
    IVar11 = ImGui::GetCursorScreenPos();
    local_88 = IVar10.x;
    fStack_84 = IVar10.y;
    IVar10.x = local_88 - fVar12 * 0.5;
    IVar10.y = fStack_84 - fVar12 * 0.5;
    pIVar4 = GImGui->CurrentWindow;
    pIVar4->WriteAccessed = true;
    (pIVar4->DC).CursorPos = IVar10;
    buff1._0_4_ = fVar12;
    buff1._4_4_ = fVar12;
    ImGui::InvisibleButton(id,(ImVec2 *)buff1,0);
    pIVar4 = GImGui->CurrentWindow;
    pIVar4->WriteAccessed = true;
    (pIVar4->DC).CursorPos = IVar11;
    PushPlotClipRect(0.0);
    bVar7 = ImGui::IsItemHovered(0);
    if ((bVar7) || (bVar7 = ImGui::IsItemActive(), bVar7)) {
      ImDrawList::AddCircleFilled(this,&pos,radius * 1.5,col_00,0);
      pIVar5 = pIVar6->CurrentPlot;
      pIVar5->PlotHovered = false;
      if (show_label) {
        fVar12 = (GImGui->Style).MouseCursorScale;
        label_pos.y = pos.y + fVar12 * 8.0;
        label_pos.x = pos.x + fVar12 * 16.0;
        LabelAxisValue(&pIVar5->XAxis,&pIVar6->XTicks,*x,buff1,0x20);
        LabelAxisValue(pIVar6->CurrentPlot->YAxis + iVar3,pIVar6->YTicks + iVar3,*y,buff2,0x20);
        local_60.x = 0.0001;
        local_60.y = 1e-05;
        ImPlotAnnotationCollection::Append
                  (&pIVar6->Annotations,&label_pos,&local_60,col_00,
                   -(uint)(color.z * 0.114 + color.x * 0.299 + color.y * 0.587 <= 0.5) | 0xff000000,
                   true,"%s = %s,%s",id,buff1,buff2);
      }
    }
    else {
      ImDrawList::AddCircleFilled(this,&pos,radius,col_00,0);
    }
    ImGui::PopClipRect();
    bVar7 = ImGui::IsItemActive();
    bVar8 = false;
    if ((bVar7) && (bVar7 = ImGui::IsMouseDragging(0,-1.0), bVar7)) {
      IVar14 = GetPlotMousePos(-1);
      *x = IVar14.x;
      IVar14 = GetPlotMousePos(-1);
      *y = IVar14.y;
      dVar1 = *x;
      pIVar5 = pIVar6->CurrentPlot;
      dVar2 = (pIVar5->XAxis).Range.Min;
      dVar13 = (pIVar5->XAxis).Range.Max;
      if (dVar1 <= dVar13) {
        dVar13 = dVar1;
      }
      uVar9 = -(ulong)(dVar1 < dVar2);
      *x = (double)(uVar9 & (ulong)dVar2 | ~uVar9 & (ulong)dVar13);
      dVar1 = *y;
      dVar2 = pIVar5->YAxis[iVar3].Range.Min;
      dVar13 = pIVar5->YAxis[iVar3].Range.Max;
      if (dVar1 <= dVar13) {
        dVar13 = dVar1;
      }
      uVar9 = -(ulong)(dVar1 < dVar2);
      *y = (double)(~uVar9 & (ulong)dVar13 | (ulong)dVar2 & uVar9);
      bVar8 = true;
    }
    return bVar8;
  }
  return false;
}

Assistant:

bool DragPoint(const char* id, double* x, double* y, bool show_label, const ImVec4& col, float radius) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "DragPoint() needs to be called between BeginPlot() and EndPlot()!");
    const float grab_size = ImMax(5.0f, 2*radius);
    const bool outside = !GetPlotLimits().Contains(*x,*y);
    if (outside)
        return false;
    const ImVec4 color = IsColorAuto(col) ? ImGui::GetStyleColorVec4(ImGuiCol_Text) : col;
    const ImU32 col32 = ImGui::ColorConvertFloat4ToU32(color);
    ImDrawList& DrawList = *GetPlotDrawList();
    const ImVec2 pos = PlotToPixels(*x,*y);
    int yax = GetCurrentYAxis();
    ImVec2 old_cursor_pos = ImGui::GetCursorScreenPos();
    ImVec2 new_cursor_pos = ImVec2(pos - ImVec2(grab_size,grab_size)*0.5f);
    ImGui::GetCurrentWindow()->DC.CursorPos = new_cursor_pos;
    ImGui::InvisibleButton(id, ImVec2(grab_size, grab_size));
    ImGui::GetCurrentWindow()->DC.CursorPos = old_cursor_pos;
    PushPlotClipRect();
    if (ImGui::IsItemHovered() || ImGui::IsItemActive()) {
        DrawList.AddCircleFilled(pos, 1.5f*radius, (col32));
        gp.CurrentPlot->PlotHovered = false;
        if (show_label) {
            ImVec2 label_pos = pos + ImVec2(16 * GImGui->Style.MouseCursorScale, 8 * GImGui->Style.MouseCursorScale);
            char buff1[32];
            char buff2[32];
            LabelAxisValue(gp.CurrentPlot->XAxis, gp.XTicks, *x, buff1, 32);
            LabelAxisValue(gp.CurrentPlot->YAxis[yax], gp.YTicks[yax], *y, buff2, 32);
            gp.Annotations.Append(label_pos, ImVec2(0.0001f,0.00001f), col32, CalcTextColor(color), true, "%s = %s,%s", id, buff1, buff2);
        }
    }
    else {
        DrawList.AddCircleFilled(pos, radius, col32);
    }
    PopPlotClipRect();


    bool dragging = false;
    if (ImGui::IsItemActive() && ImGui::IsMouseDragging(0)) {
        *x = ImPlot::GetPlotMousePos().x;
        *y = ImPlot::GetPlotMousePos().y;
        *x = ImClamp(*x, gp.CurrentPlot->XAxis.Range.Min, gp.CurrentPlot->XAxis.Range.Max);
        *y = ImClamp(*y, gp.CurrentPlot->YAxis[yax].Range.Min, gp.CurrentPlot->YAxis[yax].Range.Max);
        dragging = true;
    }
    return dragging;
}